

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)'\x00'>::dec
          (basic_dynamic_gauge<long,_(unsigned_char)__x00_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
          *labels_value,long value)

{
  atomic<long> *paVar1;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_bool>
  ret;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  view;
  anon_class_1_0_00000001 local_39;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_bool>
  local_38;
  key_type local_20;
  
  local_20._M_ptr = (pointer)0x0;
  util::internal::
  map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>>
  ::
  try_emplace_with_op<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::try_emplace<std::array<std::__cxx11::string,0ul>const&>(std::array<std::__cxx11::string,0ul>const&)::_lambda(auto:1)_1_,std::array<std::__cxx11::string,0ul>const&>
            (&local_38,
             (map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>>
              *)(this->super_basic_dynamic_counter<long,_(unsigned_char)__x00_>).
                super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>.map_.shards_.
                super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::value_type>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,&local_20,&local_39,labels_value);
  if (local_38.second == true) {
    LOCK();
    paVar1 = &(this->super_basic_dynamic_counter<long,_(unsigned_char)__x00_>).
              super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>.map_.size_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  LOCK();
  ((local_38.first.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->value).super___atomic_base<long>._M_i =
       ((local_38.first.
         super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->value).super___atomic_base<long>._M_i - value;
  UNLOCK();
  if (local_38.first.
      super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.first.
               super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void dec(const std::array<std::string, N>& labels_value,
           value_type value = 1) {
    detail::dec_impl(Base::try_emplace(labels_value).first->value, value);
  }